

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O1

void __thiscall
VideoHppGenerator::readEnumsEnum(VideoHppGenerator *this,XMLElement *element,iterator enumIt)

{
  char *pcVar1;
  int line;
  size_t sVar2;
  pointer pcVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  undefined1 auVar6 [8];
  _Base_ptr p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  const_iterator cVar12;
  _Rb_tree_node_base *p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Base_ptr *pp_Var17;
  long lVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  bool bVar21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_02;
  string name;
  string prefix;
  string alias;
  XMLElement *childElement;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attributes;
  allocator_type local_2ac;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2ab;
  allocator_type local_2aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2a9;
  undefined1 local_2a8 [8];
  _Base_ptr p_Stack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Base_ptr local_288;
  size_t sStack_280;
  undefined1 local_278 [32];
  _Base_ptr local_258;
  size_t sStack_250;
  undefined1 local_248 [32];
  _Base_ptr local_228;
  size_t sStack_220;
  undefined1 local_218 [32];
  _Base_ptr local_1f8;
  size_t sStack_1f0;
  _Base_ptr local_1e0;
  undefined1 local_1d8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_188 [32];
  _Base_ptr local_168;
  size_t sStack_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [8];
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  _Alloc_hider local_120;
  undefined1 local_110 [16];
  int local_100;
  _Base_ptr local_e8 [6];
  undefined1 local_b8 [88];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  line = (element->super_XMLNode)._parseLineNum;
  local_1e0 = enumIt._M_node;
  getAttributes_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,element);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"alias","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_60,(key_type *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar12._M_node == &local_60._M_impl.super__Rb_tree_header) {
    local_218._24_8_ = local_218 + 8;
    local_218._16_8_ = (_Base_ptr)0x0;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = 0;
    sStack_1f0 = 0;
    local_1f8 = (_Base_ptr)local_218._24_8_;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[5],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_158,(char (*) [5])"name",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218);
    local_278._24_8_ = local_278 + 8;
    local_278._16_8_ = (_Base_ptr)0x0;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = 0;
    sStack_250 = 0;
    local_258 = (_Base_ptr)local_278._24_8_;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[6],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_110 + 8),(char (*) [6])"value",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_278);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_158;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_2a8,__l_01,&local_2a9,(allocator_type *)&local_2aa);
    local_188._24_8_ = local_188 + 8;
    local_188._16_8_ = 0;
    local_188._0_8_ = (pointer)0x0;
    local_188._8_8_ = 0;
    sStack_160 = 0;
    local_168 = (_Base_ptr)local_188._24_8_;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1d8,(char (*) [8])"comment",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_1d8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_248,__l_02,&local_2ab,&local_2ac);
    checkAttributes(line,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_60,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_2a8,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_248);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_248);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1b8);
    pcVar1 = local_1d8 + 0x10;
    if ((char *)local_1d8._0_8_ != pcVar1) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_2a8);
    lVar18 = -0xa0;
    pp_Var17 = local_e8;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pp_Var17);
      if ((_Base_ptr)(pp_Var17 + -2) != pp_Var17[-4]) {
        operator_delete(pp_Var17[-4],*(long *)(pp_Var17 + -2) + 1);
      }
      pp_Var17 = pp_Var17 + -10;
      lVar18 = lVar18 + 0x50;
    } while (lVar18 != 0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
    local_2a8 = (undefined1  [8])0x0;
    p_Stack_2a0 = (_Base_ptr)0x0;
    local_298._M_allocated_capacity = 0;
    local_158 = (undefined1  [8])
                tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
    for (; local_158 != (undefined1  [8])0x0;
        local_158 = (undefined1  [8])
                    tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_158,(char *)0x0)) {
      if (p_Stack_2a0 == (_Base_ptr)local_298._M_allocated_capacity) {
        std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
        _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                  ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>
                    *)local_2a8,(iterator)p_Stack_2a0,(XMLElement **)local_158);
      }
      else {
        *(undefined1 (*) [8])p_Stack_2a0 = local_158;
        p_Stack_2a0 = (_Base_ptr)((long)p_Stack_2a0 + 8);
      }
    }
    local_148._8_8_ = local_158 + 8;
    local_148._0_8_ = 0;
    local_158 = (undefined1  [8])0x0;
    auStack_150 = (undefined1  [8])0x0;
    aStack_130._M_allocated_capacity = 0;
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._16_8_ = (_Base_ptr)0x0;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = 0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
    local_1b8._M_impl._0_8_ = local_1d8._24_8_;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._8_8_;
    checkElements(line,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                        *)local_2a8,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)local_158,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_158);
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8,local_298._M_allocated_capacity - (long)local_2a8);
    }
    local_1d8._8_8_ = 0;
    local_1d8._16_8_ = local_1d8._16_8_ & 0xffffffffffffff00;
    local_2a8 = (undefined1  [8])&local_298;
    p_Stack_2a0 = (_Base_ptr)0x0;
    local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffffffffff00;
    p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1d8._0_8_ = pcVar1;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1),"name");
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
        if ((iVar11 == 0) ||
           (iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var13 + 1),"value"),
           pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
           iVar11 == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pbVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var13 + 2));
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != &local_60._M_impl.super__Rb_tree_header);
    }
    toUpperCase((string *)local_158,(string *)(local_1e0 + 1));
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     "_");
    local_218._0_8_ = local_218 + 0x10;
    pcVar3 = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar16) {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
      local_218._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
    }
    else {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
      local_218._0_8_ = pcVar3;
    }
    local_218._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((ulong)local_1d8._8_8_ < (ulong)local_218._8_8_) {
      bVar21 = false;
    }
    else if (local_218._8_8_ == 0) {
      bVar21 = true;
    }
    else {
      iVar11 = bcmp((void *)local_1d8._0_8_,(void *)local_218._0_8_,local_218._8_8_);
      bVar21 = iVar11 == 0;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   "encountered enum value <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "> that does not begin with expected prefix <");
    local_248._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ == paVar16) {
      local_248._16_8_ = paVar16->_M_allocated_capacity;
      local_248._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_248._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248,(char *)local_218._0_8_,local_218._8_8_);
    pcVar3 = local_278 + 0x10;
    local_278._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._0_8_ == paVar16) {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
      local_278._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_278._0_8_ = pcVar3;
    }
    else {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_278._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     ">");
    local_158 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if (local_158 == (undefined1  [8])paVar16) {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_148._8_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_158 = (undefined1  [8])local_148;
    }
    else {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
    }
    auStack_150 = (undefined1  [8])pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    checkForError(bVar21,line,(string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((pointer)local_278._0_8_ != pcVar3) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
    p_Var19 = p_Stack_2a0;
    auVar6 = local_2a8;
    bVar21 = true;
    if (p_Stack_2a0 != (_Base_ptr)0x0) {
      p_Var20 = (_Base_ptr)0x0;
      do {
        pvVar15 = memchr("0123456789",(int)*(char *)((long)auVar6 + (long)p_Var20),10);
        if (pvVar15 == (void *)0x0) goto LAB_0010e581;
        p_Var20 = (_Base_ptr)((long)&p_Var20->_M_color + 1);
      } while (p_Var19 != p_Var20);
      p_Var20 = (_Base_ptr)0xffffffffffffffff;
LAB_0010e581:
      if (p_Var20 != (_Base_ptr)0xffffffffffffffff) {
        local_158 = (undefined1  [8])p_Var19;
        auStack_150 = local_2a8;
        bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_158,"0x");
        p_Var19 = p_Stack_2a0;
        auVar6 = local_2a8;
        if (bVar10) {
          if ((_Base_ptr)0x2 < p_Stack_2a0) {
            p_Var20 = (_Base_ptr)0x2;
            do {
              pvVar15 = memchr("0123456789ABCDEF",(int)*(char *)((long)auVar6 + (long)p_Var20),0x10)
              ;
              if (pvVar15 == (void *)0x0) goto LAB_0010e5f7;
              p_Var20 = (_Base_ptr)((long)&p_Var20->_M_color + 1);
            } while (p_Var19 != p_Var20);
            p_Var20 = (_Base_ptr)0xffffffffffffffff;
LAB_0010e5f7:
            bVar21 = p_Var20 == (_Base_ptr)0xffffffffffffffff;
          }
        }
        else {
          bVar21 = false;
        }
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   "enum value uses unknown constant <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     ">");
    local_158 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if (local_158 == (undefined1  [8])paVar16) {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_148._8_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_158 = (undefined1  [8])local_148;
    }
    else {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
    }
    auStack_150 = (undefined1  [8])pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    checkForError(bVar21,line,(string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((pointer)local_278._0_8_ != pcVar3) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    uVar9 = local_1d8._8_8_;
    uVar8 = local_1d8._0_8_;
    p_Var19 = *(_Base_ptr *)(local_1e0 + 2);
    p_Var20 = local_1e0[2]._M_parent;
    bVar21 = p_Var19 == p_Var20;
    if (!bVar21) {
      bVar21 = false;
      do {
        sVar2 = *(size_t *)(p_Var19 + 1);
        if ((sVar2 == uVar9) &&
           ((sVar2 == 0 || (iVar11 = bcmp(p_Var19->_M_right,(void *)uVar8,sVar2), iVar11 == 0))))
        break;
        p_Var19 = p_Var19 + 3;
        bVar21 = p_Var19 == p_Var20;
      } while (!bVar21);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   "enum value <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "> already part of enum <");
    local_248._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ == paVar16) {
      local_248._16_8_ = paVar16->_M_allocated_capacity;
      local_248._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_248._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248,*(char **)(local_1e0 + 1),(size_type)local_1e0[1]._M_parent);
    local_278._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._0_8_ == paVar16) {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
      local_278._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_278._0_8_ = pcVar3;
    }
    else {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_278._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     ">");
    local_158 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if (local_158 == (undefined1  [8])paVar16) {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_148._8_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_158 = (undefined1  [8])local_148;
    }
    else {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
    }
    auStack_150 = (undefined1  [8])pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    checkForError(bVar21,line,(string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((pointer)local_278._0_8_ != pcVar3) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
    local_158 = (undefined1  [8])0x0;
    auStack_150 = (undefined1  [8])0x0;
    local_148._0_8_ = 0;
    local_148._8_8_ = &aStack_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_148 + 8),local_1d8._0_8_,(char *)(local_1d8._0_8_ + local_1d8._8_8_)
              );
    local_120._M_p = (pointer)local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_2a8,
               (char *)((long)local_2a8 + (long)&p_Stack_2a0->_M_color));
    local_100 = line;
    std::vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
    ::emplace_back<VideoHppGenerator::EnumValueData>
              ((vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
                *)(local_1e0 + 2),(EnumValueData *)local_158);
    if ((_Base_ptr)local_120._M_p != (_Base_ptr)local_110) {
      operator_delete(local_120._M_p,local_110._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._8_8_ != &aStack_130) {
      operator_delete((void *)local_148._8_8_,(ulong)(aStack_130._M_allocated_capacity + 1));
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_158);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_1d8._0_8_ == local_1d8 + 0x10) goto LAB_0010e2e0;
  }
  else {
    local_298._8_8_ = &p_Stack_2a0;
    local_298._M_allocated_capacity = 0;
    local_2a8 = (undefined1  [8])0x0;
    p_Stack_2a0 = (_Base_ptr)0x0;
    sStack_280 = 0;
    local_288 = (_Base_ptr)local_298._8_8_;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[6],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_158,(char (*) [6])"alias",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2a8);
    local_188._0_8_ = local_188 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"aliased","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_188;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_218,__l,&local_2a9,&local_2aa);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[11],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_110 + 8),(char (*) [11])"deprecated",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218);
    local_278._24_8_ = local_278 + 8;
    local_278._16_8_ = (_Base_ptr)0x0;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = 0;
    sStack_250 = 0;
    local_258 = (_Base_ptr)local_278._24_8_;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[5],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_b8,(char (*) [5])"name",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_278);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_158;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_1d8,__l_00,&local_2ab,&local_2ac);
    local_248._24_8_ = local_248 + 8;
    local_248._16_8_ = (_Base_ptr)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = 0;
    sStack_220 = 0;
    local_228 = (_Base_ptr)local_248._24_8_;
    checkAttributes(line,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_60,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_1d8,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_248);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_248);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_1d8);
    lVar18 = -0xf0;
    pp_Var17 = (_Base_ptr *)(local_b8 + 0x20);
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pp_Var17);
      if ((_Base_ptr)(pp_Var17 + -2) != pp_Var17[-4]) {
        operator_delete(pp_Var17[-4],*(long *)(pp_Var17 + -2) + 1);
      }
      pp_Var17 = pp_Var17 + -10;
      lVar18 = lVar18 + 0x50;
    } while (lVar18 != 0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2a8);
    local_2a8 = (undefined1  [8])0x0;
    p_Stack_2a0 = (_Base_ptr)0x0;
    local_298._M_allocated_capacity = 0;
    local_158 = (undefined1  [8])
                tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
    for (; local_158 != (undefined1  [8])0x0;
        local_158 = (undefined1  [8])
                    tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_158,(char *)0x0)) {
      if (p_Stack_2a0 == (_Base_ptr)local_298._M_allocated_capacity) {
        std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
        _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                  ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>
                    *)local_2a8,(iterator)p_Stack_2a0,(XMLElement **)local_158);
      }
      else {
        *(undefined1 (*) [8])p_Stack_2a0 = local_158;
        p_Stack_2a0 = (_Base_ptr)((long)p_Stack_2a0 + 8);
      }
    }
    local_148._8_8_ = local_158 + 8;
    local_148._0_8_ = 0;
    local_158 = (undefined1  [8])0x0;
    auStack_150 = (undefined1  [8])0x0;
    aStack_130._M_allocated_capacity = 0;
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._16_8_ = (_Base_ptr)0x0;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = 0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
    local_1b8._M_impl._0_8_ = local_1d8._24_8_;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._8_8_;
    checkElements(line,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                        *)local_2a8,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)local_158,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_158);
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8,local_298._M_allocated_capacity - (long)local_2a8);
    }
    local_1d8._0_8_ = local_1d8 + 0x10;
    local_1d8._8_8_ = 0;
    local_1d8._16_8_ = local_1d8._16_8_ & 0xffffffffffffff00;
    local_2a8 = (undefined1  [8])&local_298;
    p_Stack_2a0 = (_Base_ptr)0x0;
    local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffffffffff00;
    p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1),"alias");
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
        if ((iVar11 == 0) ||
           (iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var13 + 1),"name"),
           pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
           iVar11 == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pbVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var13 + 2));
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != &local_60._M_impl.super__Rb_tree_header);
    }
    uVar9 = local_1d8._8_8_;
    uVar8 = local_1d8._0_8_;
    if (p_Stack_2a0 == (_Base_ptr)0x0) {
      __assert_fail("!name.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                    ,0x1ea,
                    "void VideoHppGenerator::readEnumsEnum(const tinyxml2::XMLElement *, std::map<std::string, EnumData>::iterator)"
                   );
    }
    p_Var19 = *(_Base_ptr *)(local_1e0 + 2);
    p_Var20 = local_1e0[2]._M_parent;
    while ((p_Var19 != p_Var20 &&
           ((sVar2 = *(size_t *)(p_Var19 + 1), sVar2 != uVar9 ||
            ((sVar2 != 0 && (iVar11 = bcmp(p_Var19->_M_right,(void *)uVar8,sVar2), iVar11 != 0))))))
          ) {
      p_Var19 = p_Var19 + 3;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   "enum value <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     "> uses unknown alias <");
    local_278._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._0_8_ == paVar16) {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
      local_278._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_278._0_8_ = local_278 + 0x10;
    }
    else {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_278._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_278,(char *)local_1d8._0_8_,local_1d8._8_8_);
    pcVar3 = local_218 + 0x10;
    local_218._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ == paVar16) {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
      local_218._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_218._0_8_ = pcVar3;
    }
    else {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_218._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     ">");
    local_158 = (undefined1  [8])local_148;
    pcVar4 = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar16) {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_148._8_8_ = *(long *)((long)&pbVar14->field_2 + 8);
    }
    else {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_158 = (undefined1  [8])pcVar4;
    }
    auStack_150 = (undefined1  [8])pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    checkForError(p_Var19 != p_Var20,line,(string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((pointer)local_218._0_8_ != pcVar3) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    p_Var7 = p_Stack_2a0;
    auVar6 = local_2a8;
    p_Var20 = *(_Base_ptr *)p_Var19;
    p_Var5 = p_Var19->_M_parent;
    while ((p_Var20 != p_Var5 &&
           ((__n = p_Var20->_M_parent, __n != p_Var7 ||
            ((__n != (_Base_ptr)0x0 &&
             (iVar11 = bcmp(*(void **)p_Var20,(void *)auVar6,(size_t)__n), iVar11 != 0))))))) {
      p_Var20 = (_Base_ptr)&p_Var20[1]._M_parent;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   "enum alias <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     "> already listed for enum value <");
    local_278._0_8_ = local_278 + 0x10;
    pcVar4 = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar16) {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
      local_278._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
    }
    else {
      local_278._16_8_ = paVar16->_M_allocated_capacity;
      local_278._0_8_ = pcVar4;
    }
    local_278._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_278,(char *)local_1d8._0_8_,local_1d8._8_8_);
    local_218._0_8_ = (pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ == paVar16) {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
      local_218._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_218._0_8_ = pcVar3;
    }
    else {
      local_218._16_8_ = paVar16->_M_allocated_capacity;
    }
    local_218._8_8_ = pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     ">");
    local_158 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
    paVar16 = &pbVar14->field_2;
    if (local_158 == (undefined1  [8])paVar16) {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
      local_148._8_8_ = *(long *)((long)&pbVar14->field_2 + 8);
      local_158 = (undefined1  [8])local_148;
    }
    else {
      local_148._0_8_ = paVar16->_M_allocated_capacity;
    }
    auStack_150 = (undefined1  [8])pbVar14->_M_string_length;
    (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar14->_M_string_length = 0;
    (pbVar14->field_2)._M_local_buf[0] = '\0';
    checkForError(p_Var20 == p_Var5,line,(string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if ((pointer)local_218._0_8_ != pcVar3) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_2a8,
               (char *)((long)local_2a8 + (long)&p_Stack_2a0->_M_color));
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_138._4_4_,line);
    std::
    vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
    ::emplace_back<std::pair<std::__cxx11::string,int>>
              ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                *)p_Var19,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_1d8._0_8_ == local_1d8 + 0x10) goto LAB_0010e2e0;
  }
  operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
LAB_0010e2e0:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VideoHppGenerator::readEnumsEnum( tinyxml2::XMLElement const * element, std::map<std::string, EnumData>::iterator enumIt )
{
  int                                line       = element->GetLineNum();
  std::map<std::string, std::string> attributes = getAttributes( element );
  if ( attributes.contains( "alias" ) )
  {
    checkAttributes( line, attributes, { { "alias", {} }, { "deprecated", { "aliased" } }, { "name", {} } }, {} );
    checkElements( line, getChildElements( element ), {} );

    std::string alias, name;
    for ( auto const & attribute : attributes )
    {
      if ( attribute.first == "alias" )
      {
        alias = attribute.second;
      }
      else if ( attribute.first == "name" )
      {
        name = attribute.second;
      }
    }
    assert( !name.empty() );

    auto valueIt = std::ranges::find_if( enumIt->second.values, [&alias]( EnumValueData const & evd ) { return evd.name == alias; } );
    checkForError( valueIt != enumIt->second.values.end(), line, "enum value <" + name + "> uses unknown alias <" + alias + ">" );
    checkForError( std::ranges::find_if( valueIt->aliases, [&name]( auto const & alias ) { return alias.first == name; } ) == valueIt->aliases.end(),
                   line,
                   "enum alias <" + name + "> already listed for enum value <" + alias + ">" );

    valueIt->aliases.push_back( { name, line } );
  }
  else
  {
    checkAttributes( line, attributes, { { "name", {} }, { "value", {} } }, { { "comment", {} } } );
    checkElements( line, getChildElements( element ), {} );

    std::string name, value;
    for ( auto const & attribute : attributes )
    {
      if ( attribute.first == "name" )
      {
        name = attribute.second;
      }
      else if ( attribute.first == "value" )
      {
        value = attribute.second;
      }
    }

    std::string prefix = toUpperCase( enumIt->first ) + "_";
    checkForError( name.starts_with( prefix ), line, "encountered enum value <" + name + "> that does not begin with expected prefix <" + prefix + ">" );
    checkForError( isNumber( value ) || isHexNumber( value ), line, "enum value uses unknown constant <" + value + ">" );

    checkForError( std::ranges::none_of( enumIt->second.values, [&name]( EnumValueData const & evd ) { return evd.name == name; } ),
                   line,
                   "enum value <" + name + "> already part of enum <" + enumIt->first + ">" );
    enumIt->second.values.push_back( { {}, name, value, line } );
  }
}